

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

void __thiscall
icu_63::MessagePatternList<double,_8>::copyFrom
          (MessagePatternList<double,_8> *this,MessagePatternList<double,_8> *other,int32_t length,
          UErrorCode *errorCode)

{
  double *pdVar1;
  
  if ((length < 1) || (U_ZERO_ERROR < *errorCode)) {
    return;
  }
  if (((this->a).capacity < length) &&
     (pdVar1 = MaybeStackArray<double,_8>::resize(&this->a,length,0), pdVar1 == (double *)0x0)) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    return;
  }
  memcpy((this->a).ptr,(other->a).ptr,(ulong)(uint)length << 3);
  return;
}

Assistant:

void
MessagePatternList<T, stackCapacity>::copyFrom(
        const MessagePatternList<T, stackCapacity> &other,
        int32_t length,
        UErrorCode &errorCode) {
    if(U_SUCCESS(errorCode) && length>0) {
        if(length>a.getCapacity() && NULL==a.resize(length)) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        uprv_memcpy(a.getAlias(), other.a.getAlias(), (size_t)length*sizeof(T));
    }
}